

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_common.cpp
# Opt level: O2

void __thiscall
cfd::capi::CfdCapiManager::CopyHandle
          (CfdCapiManager *this,void *source,void *destination,bool error_state_only)

{
  int iVar1;
  CfdException *this_00;
  allocator local_39;
  undefined1 local_38 [32];
  
  if (destination == (void *)0x0 || source == (void *)0x0) {
    return;
  }
  iVar1 = bcmp(source,"CapiHandleData",0xf);
  if ((iVar1 == 0) && (iVar1 = bcmp(destination,"CapiHandleData",0xf), iVar1 == 0)) {
    if (!error_state_only) {
      return;
    }
    *(undefined4 *)((long)destination + 0x10) = *(undefined4 *)((long)source + 0x10);
    memcpy((void *)((long)destination + 0x15),(void *)((long)source + 0x15),0x100);
    return;
  }
  local_38._0_8_ = "cfdcapi_common.cpp";
  local_38._8_4_ = 0x187;
  local_38._16_8_ = "CopyHandle";
  core::logger::warn<>((CfdSourceLocation *)local_38,"Illegal handle data. prefix unmatch.");
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_38,"Illegal handle data.",&local_39);
  core::CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_38);
  __cxa_throw(this_00,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CfdCapiManager::CopyHandle(
    void* source, void* destination, bool error_state_only) const {
  if ((source != nullptr) && (destination != nullptr)) {
    CfdCapiHandleData* source_data = static_cast<CfdCapiHandleData*>(source);
    CfdCapiHandleData* dest_data =
        static_cast<CfdCapiHandleData*>(destination);
    size_t len = strlen(kPrefixHandleData) + 1;
    if ((memcmp(source_data->prefix, kPrefixHandleData, len) != 0) ||
        (memcmp(dest_data->prefix, kPrefixHandleData, len) != 0)) {
      warn(CFD_LOG_SOURCE, "Illegal handle data. prefix unmatch.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError, "Illegal handle data.");
    }

    if (error_state_only) {
      dest_data->error_code = source_data->error_code;
      memcpy(
          dest_data->error_message, source_data->error_message,
          sizeof(dest_data->error_message));
    } else {
      // TODO(k-matsuzawa): Currently there is no information to copy
      // bool is_outside = dest_data->is_outside;
      // memcpy(dest_data, source_data, sizeof(CfdCapiHandleData));
      // dest_data->is_outside = is_outside;
    }
  }
}